

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

path * boost::filesystem::detail::current_path(path *__return_storage_ptr__,error_code *ec)

{
  uint uVar1;
  char *__buf;
  char *pcVar2;
  uint *puVar3;
  error_category *peVar4;
  filesystem_error *this;
  ulong __size;
  error_code ec_00;
  string local_50;
  
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  __size = 0x80;
  do {
    __buf = (char *)operator_new__(__size);
    pcVar2 = getcwd(__buf,__size);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (char *)(__return_storage_ptr__->m_pathname)._M_string_length;
      strlen(__buf);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)__buf);
      if (ec != (error_code *)0x0) {
        ec->m_val = 0;
        peVar4 = system::system_category();
LAB_0010c405:
        ec->m_cat = peVar4;
      }
      operator_delete__(__buf);
      return __return_storage_ptr__;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    if ((uVar1 != 0x22) && (uVar1 != 0)) {
      if (ec == (error_code *)0x0) {
        this = (filesystem_error *)__cxa_allocate_exception(0x50);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"boost::filesystem::current_path","");
        peVar4 = system::system_category();
        ec_00._4_4_ = 0;
        ec_00.m_val = uVar1;
        ec_00.m_cat = peVar4;
        filesystem_error::filesystem_error(this,&local_50,ec_00);
        __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      peVar4 = system::system_category();
      ec->m_val = uVar1;
      goto LAB_0010c405;
    }
    if (ec != (error_code *)0x0) {
      ec->m_val = 0;
      peVar4 = system::system_category();
      ec->m_cat = peVar4;
    }
    operator_delete__(__buf);
    __size = __size * 2;
  } while( true );
}

Assistant:

BOOST_FILESYSTEM_DECL
  path current_path(error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    path cur;
    for (long path_max = 128;; path_max *=2)// loop 'til buffer large enough
    {
      boost::scoped_array<char>
        buf(new char[static_cast<std::size_t>(path_max)]);
      if (::getcwd(buf.get(), static_cast<std::size_t>(path_max))== 0)
      {
        if (error(errno != ERANGE ? errno : 0
      // bug in some versions of the Metrowerks C lib on the Mac: wrong errno set 
#         if defined(__MSL__) && (defined(macintosh) || defined(__APPLE__) || defined(__APPLE_CC__))
          && errno != 0
#         endif
          , ec, "boost::filesystem::current_path"))
        {
          break;
        }
      }
      else
      {
        cur = buf.get();
        if (ec != 0) ec->clear();
        break;
      }
    }
    return cur;

#   else
    DWORD sz;
    if ((sz = ::GetCurrentDirectoryW(0, NULL)) == 0)sz = 1;
    boost::scoped_array<path::value_type> buf(new path::value_type[sz]);
    error(::GetCurrentDirectoryW(sz, buf.get()) == 0 ? BOOST_ERRNO : 0, ec,
      "boost::filesystem::current_path");
    return path(buf.get());
#   endif
  }